

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

char * xcrypt(char *str,char *buf)

{
  int local_2c;
  byte *pbStack_28;
  int bitmask;
  char *q;
  char *p;
  char *buf_local;
  char *str_local;
  
  local_2c = 1;
  pbStack_28 = (byte *)buf;
  q = str;
  while (*q != '\0') {
    *pbStack_28 = *q;
    if ((*pbStack_28 & 0x60) != 0) {
      *pbStack_28 = *pbStack_28 ^ (byte)local_2c;
    }
    local_2c = local_2c * 2;
    if (0x1f < local_2c) {
      local_2c = 1;
    }
    pbStack_28 = pbStack_28 + 1;
    q = q + 1;
  }
  *pbStack_28 = 0;
  return buf;
}

Assistant:

char *xcrypt(const char *str, char *buf) /* trivial text encryption routine (see makedefs) */
{
    const char *p;
    char *q;
    int bitmask;

    for (bitmask = 1, p = str, q = buf; *p; q++) {
	*q = *p++;
	if (*q & (32|64)) *q ^= bitmask;
	if ((bitmask <<= 1) >= 32) bitmask = 1;
    }
    *q = '\0';
    return buf;
}